

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O0

size_t check_for_missing<PredictionData<double,int>>
                 (PredictionData<double,_int> *prediction_data,Imputer *imputer,size_t *ix_arr,
                 int nthreads)

{
  undefined8 uVar1;
  uint uVar2;
  reference pvVar3;
  long in_RDX;
  ulong *in_RSI;
  long *in_RDI;
  size_t row_1;
  size_t temp;
  size_t st;
  size_t col_3;
  size_t col_2;
  int ix;
  size_t col_1;
  size_t col;
  size_t row;
  vector<char,_std::allocator<char>_> has_missing;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  value_type_conflict5 *in_stack_ffffffffffffff60;
  vector<char,_std::allocator<char>_> *this;
  size_type in_stack_ffffffffffffff68;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  size_t sVar4;
  ulong local_88;
  ulong local_80;
  int local_74;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  allocator<char> local_42;
  undefined1 local_41;
  vector<char,_std::allocator<char>_> local_40;
  long local_20;
  ulong *local_18;
  long *local_10;
  size_t local_8;
  
  local_41 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::allocator<char>::~allocator(&local_42);
  local_60 = 0;
  do {
    if ((ulong)local_10[2] <= local_60) {
      sVar4 = 0;
      for (this = (vector<char,_std::allocator<char>_> *)0x0;
          this < (vector<char,_std::allocator<char>_> *)local_10[2];
          this = (vector<char,_std::allocator<char>_> *)
                 &(this->super__Vector_base<char,_std::allocator<char>_>)._M_impl.field_0x1) {
        pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&local_40,(size_type)this);
        if (*pvVar3 != '\0') {
          uVar1 = *(undefined8 *)(local_20 + sVar4 * 8);
          *(undefined8 *)(local_20 + sVar4 * 8) = *(undefined8 *)(local_20 + (long)this * 8);
          *(undefined8 *)(local_20 + (long)this * 8) = uVar1;
          sVar4 = sVar4 + 1;
        }
      }
      local_8 = sVar4;
      if (sVar4 == 0) {
        local_8 = 0;
      }
      std::vector<char,_std::allocator<char>_>::~vector(this);
      return local_8;
    }
    if (*local_10 == 0) {
      if (local_10[9] != 0) {
        for (local_74 = *(int *)(local_10[0xb] + local_60 * 4);
            local_74 < *(int *)(local_10[0xb] + 4 + local_60 * 4); local_74 = local_74 + 1) {
          uVar2 = std::isnan(*(double *)(local_10[9] + (long)local_74 * 8));
          if (((uVar2 & 1) != 0) ||
             (uVar2 = std::isinf(*(double *)(local_10[9] + (long)local_74 * 8)), (uVar2 & 1) != 0))
          {
            pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&local_40,local_60);
            *pvVar3 = '\x01';
            break;
          }
        }
      }
    }
    else if ((*(byte *)(local_10 + 3) & 1) == 0) {
      for (local_70 = 0; local_70 < *local_18; local_70 = local_70 + 1) {
        uVar2 = std::isnan(*(double *)(*local_10 + (local_70 + local_60 * *local_18) * 8));
        if (((uVar2 & 1) != 0) ||
           (uVar2 = std::isinf(*(double *)(*local_10 + (local_70 + local_60 * *local_18) * 8)),
           (uVar2 & 1) != 0)) {
          pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&local_40,local_60);
          *pvVar3 = '\x01';
          break;
        }
      }
    }
    else {
      for (local_68 = 0; local_68 < *local_18; local_68 = local_68 + 1) {
        uVar2 = std::isnan(*(double *)(*local_10 + (local_60 + local_68 * local_10[2]) * 8));
        if (((uVar2 & 1) != 0) ||
           (uVar2 = std::isinf(*(double *)(*local_10 + (local_60 + local_68 * local_10[2]) * 8)),
           (uVar2 & 1) != 0)) {
          pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&local_40,local_60);
          *pvVar3 = '\x01';
          break;
        }
      }
    }
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&local_40,local_60);
    if (*pvVar3 == '\0') {
      if ((*(byte *)(local_10 + 3) & 1) == 0) {
        for (local_88 = 0; local_88 < local_18[1]; local_88 = local_88 + 1) {
          if (*(int *)(local_10[1] + (local_88 + local_60 * local_18[1]) * 4) < 0) {
            pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&local_40,local_60);
            *pvVar3 = '\x01';
            break;
          }
        }
      }
      else {
        for (local_80 = 0; local_80 < local_18[1]; local_80 = local_80 + 1) {
          if (*(int *)(local_10[1] + (local_60 + local_80 * local_10[2]) * 4) < 0) {
            pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&local_40,local_60);
            *pvVar3 = '\x01';
            break;
          }
        }
      }
    }
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

size_t check_for_missing(PredictionData  &prediction_data,
                         Imputer         &imputer,
                         size_t          ix_arr[],
                         int             nthreads)
{
    std::vector<char> has_missing(prediction_data.nrows, false);

    #pragma omp parallel for schedule(static) num_threads(nthreads) shared(has_missing, prediction_data, imputer)
    for (size_t_for row = 0; row < (decltype(row))prediction_data.nrows; row++)
    {
        if (prediction_data.numeric_data != NULL)
        {
            if (prediction_data.is_col_major)
            {
                for (size_t col = 0; col < imputer.ncols_numeric; col++)
                {
                    if (is_na_or_inf(prediction_data.numeric_data[row + col * prediction_data.nrows]))
                    {
                        has_missing[row] = true;
                        break;
                    }
                }
            }

            else
            {
                for (size_t col = 0; col < imputer.ncols_numeric; col++)
                {
                    if (is_na_or_inf(prediction_data.numeric_data[col + row * imputer.ncols_numeric]))
                    {
                        has_missing[row] = true;
                        break;
                    }
                }
            }
        }

        else if (prediction_data.Xr != NULL)
        {
            for (auto ix = prediction_data.Xr_indptr[row]; ix < prediction_data.Xr_indptr[row + 1]; ix++)
            {
                if (is_na_or_inf(prediction_data.Xr[ix]))
                {
                    has_missing[row] = true;
                    break;
                }
            }
        }

        if (!has_missing[row])
        {
            if (prediction_data.is_col_major)
            {
                for (size_t col = 0; col < imputer.ncols_categ; col++)
                {
                    if (prediction_data.categ_data[row + col * prediction_data.nrows] < 0)
                    {
                        has_missing[row] = true;
                        break;
                    }
                }
            }

            else
            {
                for (size_t col = 0; col < imputer.ncols_categ; col++)
                {
                    if (prediction_data.categ_data[col + row * imputer.ncols_categ] < 0)
                    {
                        has_missing[row] = true;
                        break;
                    }
                }
            }
        }
    }

    size_t st = 0;
    size_t temp;
    for (size_t row = 0; row < prediction_data.nrows; row++)
    {
        if (has_missing[row])
        {
            temp        = ix_arr[st];
            ix_arr[st]  = ix_arr[row];
            ix_arr[row] = temp;
            st++;
        }
    }

    if (st == 0)
        return 0;

    return st;
}